

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_SockAddr.cpp
# Opt level: O3

size_t axl::io::getSockAddrFamilySize(uint_t family)

{
  size_t sVar1;
  
  sVar1 = 0x10;
  if (family == 10) {
    sVar1 = 0x1c;
  }
  return sVar1;
}

Assistant:

size_t
getSockAddrFamilySize(uint_t family) {
	switch (family) {
	case AF_INET:
		return sizeof(sockaddr_in);

	case AF_INET6:
		return sizeof(sockaddr_in6);

	default:
		return sizeof(sockaddr);
	}
}